

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O2

string * ApprovalTests::HelpMessages::getMisconfiguredBuildHelp
                   (string *__return_storage_ptr__,string *fileName)

{
  string helpMessage;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "* Welcome to Approval Tests.\n*\n* There seems to be a problem with your build configuration.\n* We cannot find the test source file at:\n*   [fileName]\n*\n* For details on how to fix this, please visit:\n* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/TroubleshootingMisconfiguredBuild.md\n*\n* For advanced users only:\n* If you believe you have reached this message in error, you can bypass\n* the check by calling ApprovalTestNamer::setCheckBuildConfig(false);\n"
             ,(allocator *)&local_78);
  topAndTailHelpMessage(&local_58,&local_38);
  ::std::__cxx11::string::string((string *)&local_78,"[fileName]",&local_79);
  StringUtils::replaceAll
            ((string *)__return_storage_ptr__,(string *)&local_58,&local_78,(string *)fileName);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string HelpMessages::getMisconfiguredBuildHelp(const std::string& fileName)
    {
        std::string helpMessage = R"(* Welcome to Approval Tests.
*
* There seems to be a problem with your build configuration.
* We cannot find the test source file at:
*   [fileName]
*
* For details on how to fix this, please visit:
* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/TroubleshootingMisconfiguredBuild.md
*
* For advanced users only:
* If you believe you have reached this message in error, you can bypass
* the check by calling ApprovalTestNamer::setCheckBuildConfig(false);
)";
        return StringUtils::replaceAll(
            topAndTailHelpMessage(helpMessage), "[fileName]", fileName);
    }